

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUnexpectedCommand.h
# Opt level: O3

cmCommand * __thiscall cmUnexpectedCommand::Clone(cmUnexpectedCommand *this)

{
  pointer pcVar1;
  char *pcVar2;
  cmCommand *pcVar3;
  _Alloc_hider *local_40;
  cmMakefile *local_38;
  _Alloc_hider local_30;
  size_type sStack_28;
  
  pcVar3 = (cmCommand *)operator_new(0x58);
  pcVar1 = (this->Name)._M_dataplus._M_p;
  local_40 = &local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + (this->Name)._M_string_length);
  pcVar2 = this->Error;
  pcVar3->Makefile = (cmMakefile *)0x0;
  (pcVar3->Error)._M_dataplus._M_p = (pointer)&(pcVar3->Error).field_2;
  (pcVar3->Error)._M_string_length = 0;
  (pcVar3->Error).field_2._M_local_buf[0] = '\0';
  pcVar3->_vptr_cmCommand = (_func_int **)&PTR__cmUnexpectedCommand_00671250;
  pcVar3[1]._vptr_cmCommand = (_func_int **)&pcVar3[1].Error;
  if (local_40 == &local_30) {
    pcVar3[1].Error._M_dataplus._M_p = local_30._M_p;
    pcVar3[1].Error._M_string_length = sStack_28;
  }
  else {
    pcVar3[1]._vptr_cmCommand = (_func_int **)local_40;
    pcVar3[1].Error._M_dataplus._M_p = local_30._M_p;
  }
  pcVar3[1].Makefile = local_38;
  pcVar3[1].Error.field_2._M_allocated_capacity = (size_type)pcVar2;
  return pcVar3;
}

Assistant:

cmCommand* Clone() override
  {
    return new cmUnexpectedCommand(this->Name, this->Error);
  }